

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_353748f::DumpVisitor::onValue(DumpVisitor *this,int64_t S,bool LEB)

{
  bool LEB_local;
  int64_t S_local;
  DumpVisitor *this_local;
  
  if (LEB) {
    llvm::encodeSLEB128(S,this->OS,0);
  }
  else {
    writeInteger<long>(S,this->OS,
                       (bool)(((this->super_ConstVisitor).
                               super_VisitorImpl<const_llvm::DWARFYAML::Data>.DebugInfo)->
                              IsLittleEndian & 1));
  }
  return;
}

Assistant:

void onValue(const int64_t S, const bool LEB = false) override {
    if (LEB)
      encodeSLEB128(S, OS);
    else
      writeInteger(S, OS, DebugInfo.IsLittleEndian);
  }